

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O1

void __thiscall
ParticleArrayTest_PushBack_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>::
TestBody(ParticleArrayTest_PushBack_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>
         *this)

{
  bool bVar1;
  int iVar2;
  ParticleArray particles;
  AssertionResult gtest_ar_;
  ParticleArray particlesCopy;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  AssertHelper local_a0;
  ParticleArray local_98;
  AssertionResult local_78;
  char *local_68 [2];
  Particle local_58;
  
  local_98.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Particle<(pica::Dimension)1> *)0x0;
  local_98.particles.
  super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Particle<(pica::Dimension)1> *)0x0;
  iVar2 = 0x11;
  do {
    BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>::randomParticle
              (&local_58,(BaseParticleFixture<pica::Particle<(pica::Dimension)1>_> *)this,
               (PositionType)0xc024000000000000,(PositionType)0x4024000000000000);
    if (local_98.particles.
        super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_98.particles.
        super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<pica::Particle<(pica::Dimension)1>,std::allocator<pica::Particle<(pica::Dimension)1>>>
      ::_M_realloc_insert<pica::Particle<(pica::Dimension)1>const&>
                ((vector<pica::Particle<(pica::Dimension)1>,std::allocator<pica::Particle<(pica::Dimension)1>>>
                  *)&local_98,
                 (iterator)
                 local_98.particles.
                 super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_58);
    }
    else {
      (local_98.particles.
       super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->typeIndex = local_58.typeIndex;
      *(undefined6 *)
       &(local_98.particles.
         super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->field_0x32 = local_58._50_6_;
      (local_98.particles.
       super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->factor = local_58.factor;
      (local_98.particles.
       super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->invGamma = local_58.invGamma;
      ((local_98.particles.
        super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->p).y = local_58.p.y;
      ((local_98.particles.
        super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->p).z = local_58.p.z;
      ((local_98.particles.
        super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->position).x = local_58.position.x;
      ((local_98.particles.
        super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->p).x = local_58.p.x;
      local_98.particles.
      super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_98.particles.
           super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  std::
  vector<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>::
  vector((vector<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
          *)&local_58,&local_98.particles);
  local_78.success_ =
       ParticleArrayTest<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>::
       eqParticleArrays(&this->
                         super_ParticleArrayTest<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)1>_>_>
                        ,&local_98,(ParticleArray *)&local_58);
  local_78.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!local_78.success_) {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)local_68,&local_78,"this->eqParticleArrays(particles, particlesCopy)",
               "false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x75,local_68[0]);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_68[0] != (char *)0x0) {
      operator_delete__(local_68[0]);
    }
    if (local_a8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_a8.ptr_ + 8))();
      }
      local_a8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if ((void *)local_58.position.x != (void *)0x0) {
    operator_delete((void *)local_58.position.x,(long)local_58.p.y - (long)local_58.position.x);
  }
  if (local_98.particles.
      super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.particles.
                    super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.particles.
                          super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.particles.
                          super__Vector_base<pica::Particle<(pica::Dimension)1>,_std::allocator<pica::Particle<(pica::Dimension)1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, PushBack)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    for (int i = 0; i < 17; i++)
        particles.pushBack(this->randomParticle());
    ParticleArray particlesCopy(particles);
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesCopy));
}